

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BayesianProbitRegressionValidator.cpp
# Opt level: O0

Result * CoreML::validate<(MLModelType)304>(Result *__return_storage_ptr__,Model *format)

{
  int iVar1;
  bool bVar2;
  int iVar3;
  Result local_78;
  FeatureDescription *local_50;
  FeatureDescription *featureDesc;
  RepeatedPtrField<CoreML::Specification::FeatureDescription> *pRStack_40;
  int i;
  RepeatedPtrField<CoreML::Specification::FeatureDescription> *inputFeatures;
  ModelDescription *local_28;
  ModelDescription *description;
  Model *local_18;
  Model *format_local;
  Result *result;
  
  description._7_1_ = 0;
  local_18 = format;
  format_local = (Model *)__return_storage_ptr__;
  Result::Result(__return_storage_ptr__);
  local_28 = Specification::Model::description(local_18);
  pRStack_40 = Specification::ModelDescription::input(local_28);
  featureDesc._4_4_ = 0;
  while( true ) {
    iVar1 = featureDesc._4_4_;
    iVar3 = google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::size
                      (pRStack_40);
    if (iVar3 <= iVar1) {
      return __return_storage_ptr__;
    }
    local_50 = google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::
               operator[](pRStack_40,featureDesc._4_4_);
    validateSchemaTypesIsMultiArray(&local_78,local_50,ArrayFeatureType_ArrayDataType_INT32,1,2);
    Result::operator=(__return_storage_ptr__,&local_78);
    Result::~Result(&local_78);
    bVar2 = Result::good(__return_storage_ptr__);
    if (!bVar2) break;
    featureDesc._4_4_ = featureDesc._4_4_ + 1;
  }
  return __return_storage_ptr__;
}

Assistant:

Result validate<MLModelType_bayesianProbitRegressor>(const Specification::Model& format) {
        Result result;
        const auto& description = format.description();
        const auto& inputFeatures = description.input();
        for (int i = 0; i < inputFeatures.size(); i++) {
            const auto& featureDesc = inputFeatures[i];
            result = validateSchemaTypesIsMultiArray(featureDesc, Specification::ArrayFeatureType_ArrayDataType_INT32, 1, 2);
            if (!result.good()) {
                return result;
            }
        }

        return result;
    }